

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

long strtol0X(char *str,char **endptr,char X,int base)

{
  int iVar1;
  int iVar2;
  ushort **ppuVar3;
  long lVar4;
  char *local_40;
  char *ptr;
  int s;
  long val;
  int base_local;
  char X_local;
  char **endptr_local;
  char *str_local;
  
  local_40 = str;
  while( true ) {
    ppuVar3 = __ctype_b_loc();
    if (((*ppuVar3)[(int)*local_40] & 0x2000) == 0) break;
    local_40 = local_40 + 1;
  }
  if (*local_40 == '+') {
    local_40 = local_40 + 1;
    ptr._4_4_ = 1;
  }
  else if (*local_40 == '-') {
    local_40 = local_40 + 1;
    ptr._4_4_ = -1;
  }
  else {
    ptr._4_4_ = 1;
  }
  if (*local_40 == '0') {
    iVar1 = toupper((int)local_40[1]);
    iVar2 = toupper((int)X);
    if (iVar1 == iVar2) {
      lVar4 = strtol(local_40 + 2,endptr,base);
      if (*endptr == local_40 + 2) {
        *endptr = str;
        str_local = (char *)0x0;
      }
      else {
        str_local = (char *)(ptr._4_4_ * lVar4);
      }
    }
    else {
      *endptr = str;
      str_local = (char *)0x0;
    }
  }
  else {
    *endptr = str;
    str_local = (char *)0x0;
  }
  return (long)str_local;
}

Assistant:

static long int strtol0X(const char* str, const char** endptr, char X, int base) {
    long int val;          /* stores result */
    int s = 1;             /* sign is +1 or -1 */
    const char* ptr = str; /* ptr to current position in str */

    /* skip leading whitespace */
    while (isspace((int)(*ptr)))
        ptr++;
    /* printf("1) %s\n",ptr); */

    /* scan optional sign character */
    switch (*ptr) {
        case '+':
            ptr++;
            s = 1;
            break;
        case '-':
            ptr++;
            s = -1;
            break;
        default:
            s = 1;
            break;
    }
    /* printf("2) %s\n",ptr); */

    /* '0X' prefix */
    if ((*ptr++) != '0') {
        /* printf("failed to detect '0'\n"); */
        *endptr = str;
        return 0;
    }
    /* printf("3) %s\n",ptr); */
    if (toupper(*ptr++) != toupper(X)) {
        /* printf("failed to detect '%c'\n",X); */
        *endptr = str;
        return 0;
    }
    /* printf("4) %s\n",ptr); */

    /* attempt conversion on remainder of string using strtol() */
    val = strtol(ptr, (char**)endptr, base);
    if (*endptr == ptr) {
        /* conversion failed */
        *endptr = str;
        return 0;
    }

    /* success */
    return s * val;
}